

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O3

void __thiscall pbrt::ProjectiveCamera::InitMetadata(ProjectiveCamera *this,ImageMetadata *metadata)

{
  pbrt *this_00;
  Vector3f delta;
  Transform NDCFromWorld;
  Transform TStack_328;
  Transform local_2a8;
  Transform local_228;
  Transform local_1a8;
  Transform local_128;
  Transform local_a8;
  
  this_00 = (pbrt *)&(this->super_CameraBase).cameraTransform.worldFromRender;
  AnimatedTransform::Interpolate
            (&TStack_328,(AnimatedTransform *)this,(this->super_CameraBase).shutterOpen);
  Transform::operator*(&local_2a8,(Transform *)this_00,&TStack_328);
  local_228.m.m[0][0] = local_2a8.mInv.m[0][0];
  local_228.m.m[0][1] = local_2a8.mInv.m[0][1];
  local_228.m.m[0][2] = local_2a8.mInv.m[0][2];
  local_228.m.m[0][3] = local_2a8.mInv.m[0][3];
  local_228.m.m[1][0] = local_2a8.mInv.m[1][0];
  local_228.m.m[1][1] = local_2a8.mInv.m[1][1];
  local_228.m.m[1][2] = local_2a8.mInv.m[1][2];
  local_228.m.m[1][3] = local_2a8.mInv.m[1][3];
  local_228.m.m[2][0] = local_2a8.mInv.m[2][0];
  local_228.m.m[2][1] = local_2a8.mInv.m[2][1];
  local_228.m.m[2][2] = local_2a8.mInv.m[2][2];
  local_228.m.m[2][3] = local_2a8.mInv.m[2][3];
  local_228.m.m[3][0] = local_2a8.mInv.m[3][0];
  local_228.m.m[3][1] = local_2a8.mInv.m[3][1];
  local_228.m.m[3][2] = local_2a8.mInv.m[3][2];
  local_228.m.m[3][3] = local_2a8.mInv.m[3][3];
  *(undefined8 *)&(metadata->cameraFromWorld).optionalValue = local_2a8.mInv.m[0]._0_8_;
  *(undefined8 *)((long)&(metadata->cameraFromWorld).optionalValue + 8) = local_2a8.mInv.m[0]._8_8_;
  *(undefined8 *)((long)&(metadata->cameraFromWorld).optionalValue + 0x10) =
       local_2a8.mInv.m[1]._0_8_;
  *(undefined8 *)((long)&(metadata->cameraFromWorld).optionalValue + 0x18) =
       local_2a8.mInv.m[1]._8_8_;
  *(undefined8 *)((long)&(metadata->cameraFromWorld).optionalValue + 0x20) =
       local_2a8.mInv.m[2]._0_8_;
  *(undefined8 *)((long)&(metadata->cameraFromWorld).optionalValue + 0x28) =
       local_2a8.mInv.m[2]._8_8_;
  *(undefined8 *)((long)&(metadata->cameraFromWorld).optionalValue + 0x30) =
       local_2a8.mInv.m[3]._0_8_;
  *(undefined8 *)((long)&(metadata->cameraFromWorld).optionalValue + 0x38) =
       local_2a8.mInv.m[3]._8_8_;
  (metadata->cameraFromWorld).set = true;
  delta.super_Tuple3<pbrt::Vector3,_float>.z = 0.5;
  delta.super_Tuple3<pbrt::Vector3,_float>.x = 0.5;
  delta.super_Tuple3<pbrt::Vector3,_float>.y = 0.5;
  Translate(&local_a8,this_00,delta);
  Scale(&local_128,0.5,0.5,0.5);
  Transform::operator*(&local_228,&local_a8,&local_128);
  Transform::operator*(&TStack_328,&local_228,&this->screenFromCamera);
  if ((metadata->cameraFromWorld).set != false) {
    Transform::Transform(&local_1a8,(SquareMatrix<4> *)&metadata->cameraFromWorld);
    Transform::operator*(&local_2a8,&TStack_328,&local_1a8);
    *(undefined8 *)&(metadata->NDCFromWorld).optionalValue = local_2a8.m.m[0]._0_8_;
    *(undefined8 *)((long)&(metadata->NDCFromWorld).optionalValue + 8) = local_2a8.m.m[0]._8_8_;
    *(undefined8 *)((long)&(metadata->NDCFromWorld).optionalValue + 0x10) = local_2a8.m.m[1]._0_8_;
    *(undefined8 *)((long)&(metadata->NDCFromWorld).optionalValue + 0x18) = local_2a8.m.m[1]._8_8_;
    *(undefined8 *)((long)&(metadata->NDCFromWorld).optionalValue + 0x20) = local_2a8.m.m[2]._0_8_;
    *(undefined8 *)((long)&(metadata->NDCFromWorld).optionalValue + 0x28) = local_2a8.m.m[2]._8_8_;
    *(undefined8 *)((long)&(metadata->NDCFromWorld).optionalValue + 0x30) = local_2a8.m.m[3]._0_8_;
    *(undefined8 *)((long)&(metadata->NDCFromWorld).optionalValue + 0x38) = local_2a8.m.m[3]._8_8_;
    (metadata->NDCFromWorld).set = true;
    CameraBase::InitMetadata(&this->super_CameraBase,metadata);
    return;
  }
  LogFatal<char_const(&)[4]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
             ,0xea,"Check failed: %s",(char (*) [4])0x280907c);
}

Assistant:

void ProjectiveCamera::InitMetadata(ImageMetadata *metadata) const {
    metadata->cameraFromWorld = cameraTransform.CameraFromWorld(shutterOpen).GetMatrix();

    // TODO: double check this
    Transform NDCFromWorld = Translate(Vector3f(0.5, 0.5, 0.5)) * Scale(0.5, 0.5, 0.5) *
                             screenFromCamera * *metadata->cameraFromWorld;
    metadata->NDCFromWorld = NDCFromWorld.GetMatrix();

    CameraBase::InitMetadata(metadata);
}